

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O0

char * dup_entry_string_or_bail(MMDB_entry_data_s entry_data)

{
  char *pcVar1;
  char *string;
  
  pcVar1 = mmdb_strndup((char *)entry_data._8_8_,(ulong)entry_data.offset);
  if (pcVar1 == (char *)0x0) {
    bail_out(0,"mmdb_strndup failed",0);
  }
  return pcVar1;
}

Assistant:

char *dup_entry_string_or_bail(MMDB_entry_data_s entry_data) {
    char *string = mmdb_strndup(entry_data.utf8_string, entry_data.data_size);
    if (NULL == string) {
        BAIL_OUT("mmdb_strndup failed");
    }

    return string;
}